

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O2

void ncnn::pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  undefined4 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined8 uVar16;
  size_t *psVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  void *pvVar20;
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [32];
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  undefined1 (*pauVar30) [32];
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  bool bVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  long local_c0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  
  psVar17 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar17 = &A->cstep;
  }
  lVar36 = (long)(int)*psVar17;
  uVar35 = 0;
  iVar27 = 0;
  if (0 < max_kk) {
    iVar27 = max_kk;
  }
  lVar28 = (long)i;
  local_98 = (long)k * 4;
  lVar32 = local_98 + (lVar28 + 1) * lVar36 * 4;
  lVar31 = local_98 + (lVar28 + 2) * lVar36 * 4;
  lVar29 = local_98 + (lVar28 + 3) * lVar36 * 4;
  lVar24 = (lVar28 + 4) * lVar36;
  lVar33 = local_98 + lVar36 * lVar28 * 4;
  local_c0 = (long)(k * 4) * 4;
  lVar26 = local_c0 + lVar36 * lVar28 * 4;
  local_c0 = local_c0 + lVar24 * 4;
  local_80 = local_98 + (lVar28 + 5) * lVar36 * 4;
  local_88 = local_98 + (lVar28 + 6) * lVar36 * 4;
  local_90 = local_98 + (lVar28 + 7) * lVar36 * 4;
  local_98 = local_98 + lVar24 * 4;
  pauVar30 = (undefined1 (*) [32])AT->data;
  lVar24 = (long)max_ii;
  lVar18 = lVar36 * 0x20;
  iVar11 = A->elempack;
  for (; (long)(uVar35 | 7) < lVar24; uVar35 = uVar35 + 8) {
    pauVar22 = pauVar30;
    if (iVar11 == 8) {
      pauVar19 = (undefined1 (*) [32])
                 ((long)A->data + (long)(k * 8) * 4 + (uVar35 + lVar28) * lVar36 * 4);
      iVar23 = iVar27;
      while (bVar37 = iVar23 != 0, iVar23 = iVar23 + -1, pauVar22 = pauVar30, bVar37) {
        *pauVar30 = *pauVar19;
        pauVar30 = pauVar30 + 1;
        pauVar19 = pauVar19 + 1;
      }
    }
    if (iVar11 == 4) {
      pvVar20 = A->data;
      iVar23 = iVar27;
      while (bVar37 = iVar23 != 0, iVar23 = iVar23 + -1, bVar37) {
        uVar16 = ((undefined8 *)((long)pvVar20 + lVar26))[1];
        *(undefined8 *)*pauVar22 = *(undefined8 *)((long)pvVar20 + lVar26);
        *(undefined8 *)(*pauVar22 + 8) = uVar16;
        *(undefined1 (*) [16])(*pauVar22 + 0x10) = *(undefined1 (*) [16])((long)pvVar20 + local_c0);
        pauVar22 = pauVar22 + 1;
        pvVar20 = (void *)((long)pvVar20 + 0x10);
      }
    }
    pauVar30 = pauVar22;
    if (iVar11 == 1) {
      pvVar20 = A->data;
      lVar34 = 0;
      lVar25 = 0;
      for (iVar23 = 0; iVar23 + 7 < max_kk; iVar23 = iVar23 + 8) {
        auVar6 = *(undefined1 (*) [32])((long)pvVar20 + lVar25 + lVar33);
        auVar38 = *(undefined1 (*) [32])((long)pvVar20 + lVar25 + lVar32);
        auVar39 = *(undefined1 (*) [32])((long)pvVar20 + lVar25 + lVar31);
        auVar7 = *(undefined1 (*) [32])((long)pvVar20 + lVar25 + lVar29);
        auVar8 = *(undefined1 (*) [32])((long)pvVar20 + lVar25 + local_98);
        auVar40 = *(undefined1 (*) [32])((long)pvVar20 + lVar25 + local_80);
        auVar9 = *(undefined1 (*) [32])((long)pvVar20 + lVar25 + local_88);
        auVar10 = *(undefined1 (*) [32])((long)pvVar20 + lVar25 + local_90);
        auVar15 = vunpcklps_avx(auVar6,auVar38);
        auVar38 = vunpckhps_avx(auVar6,auVar38);
        auVar6 = vunpcklps_avx(auVar39,auVar7);
        auVar39 = vunpckhps_avx(auVar39,auVar7);
        auVar41 = vunpcklps_avx(auVar8,auVar40);
        auVar7 = vunpckhps_avx(auVar8,auVar40);
        auVar42 = vunpcklps_avx(auVar9,auVar10);
        auVar8 = vunpckhps_avx(auVar9,auVar10);
        auVar40 = vunpcklpd_avx(auVar15,auVar6);
        auVar6 = vunpckhpd_avx(auVar15,auVar6);
        auVar9 = vunpcklpd_avx(auVar38,auVar39);
        auVar38 = vunpckhpd_avx(auVar38,auVar39);
        auVar10 = vunpcklpd_avx(auVar41,auVar42);
        auVar39 = vunpckhpd_avx(auVar41,auVar42);
        auVar15 = vunpcklpd_avx(auVar7,auVar8);
        auVar7 = vunpckhpd_avx(auVar7,auVar8);
        auVar41._16_16_ = auVar10._0_16_;
        auVar41._0_16_ = auVar40._0_16_;
        auVar42._16_16_ = auVar39._0_16_;
        auVar42._0_16_ = auVar6._0_16_;
        auVar43._16_16_ = auVar15._0_16_;
        auVar43._0_16_ = auVar9._0_16_;
        auVar44._16_16_ = auVar7._0_16_;
        auVar44._0_16_ = auVar38._0_16_;
        auVar8 = vperm2f128_avx(auVar40,auVar10,0x31);
        auVar6 = vperm2f128_avx(auVar6,auVar39,0x31);
        auVar39 = vperm2f128_avx(auVar9,auVar15,0x31);
        auVar38 = vperm2f128_avx(auVar38,auVar7,0x31);
        *(undefined1 (*) [32])(*pauVar22 + lVar25 * 8) = auVar41;
        *(undefined1 (*) [32])(pauVar22[1] + lVar25 * 8) = auVar42;
        *(undefined1 (*) [32])(pauVar22[2] + lVar25 * 8) = auVar43;
        *(undefined1 (*) [32])(pauVar22[3] + lVar25 * 8) = auVar44;
        *(undefined1 (*) [32])(pauVar22[4] + lVar25 * 8) = auVar8;
        *(undefined1 (*) [32])(pauVar22[5] + lVar25 * 8) = auVar6;
        *(undefined1 (*) [32])(pauVar22[6] + lVar25 * 8) = auVar39;
        *(undefined1 (*) [32])(pauVar22[7] + lVar25 * 8) = auVar38;
        pauVar30 = pauVar30 + 8;
        lVar25 = lVar25 + 0x20;
        lVar34 = lVar34 + 8;
      }
      for (; (int)lVar34 < max_kk; lVar34 = lVar34 + 1) {
        puVar1 = (undefined4 *)((long)pvVar20 + lVar34 * 4 + lVar33);
        *(undefined4 *)*pauVar30 = *puVar1;
        *(undefined4 *)(*pauVar30 + 4) = puVar1[lVar36];
        *(undefined4 *)(*pauVar30 + 8) = puVar1[lVar36 * 2];
        *(undefined4 *)(*pauVar30 + 0xc) = puVar1[lVar36 * 3];
        *(undefined4 *)(*pauVar30 + 0x10) = puVar1[lVar36 * 4];
        *(undefined4 *)(*pauVar30 + 0x14) = puVar1[lVar36 * 5];
        *(undefined4 *)(*pauVar30 + 0x18) = puVar1[lVar36 * 6];
        *(undefined4 *)(*pauVar30 + 0x1c) = puVar1[lVar36 * 7];
        pauVar30 = pauVar30 + 1;
      }
    }
    lVar33 = lVar33 + lVar18;
    lVar32 = lVar32 + lVar18;
    lVar31 = lVar31 + lVar18;
    lVar29 = lVar29 + lVar18;
    local_c0 = local_c0 + lVar18;
    lVar26 = lVar26 + lVar18;
    local_80 = local_80 + lVar18;
    local_88 = local_88 + lVar18;
    local_90 = local_90 + lVar18;
    local_98 = local_98 + lVar18;
  }
  lVar26 = lVar36 * 0x10;
  for (; (long)(uVar35 | 3) < lVar24; uVar35 = uVar35 + 4) {
    if (iVar11 == 4) {
      pauVar21 = (undefined1 (*) [16])
                 ((long)A->data + (long)(k * 4) * 4 + (uVar35 + lVar28) * lVar36 * 4);
      iVar23 = iVar27;
      while (bVar37 = iVar23 != 0, iVar23 = iVar23 + -1, bVar37) {
        *(undefined1 (*) [16])*pauVar30 = *pauVar21;
        pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
        pauVar21 = pauVar21 + 1;
      }
    }
    pauVar22 = pauVar30;
    if (iVar11 == 1) {
      pvVar20 = A->data;
      lVar18 = 0;
      for (iVar23 = 0; iVar23 + 7 < max_kk; iVar23 = iVar23 + 8) {
        auVar6 = *(undefined1 (*) [32])((long)pvVar20 + lVar18 + lVar33);
        auVar38 = *(undefined1 (*) [32])((long)pvVar20 + lVar18 + lVar32);
        auVar39 = *(undefined1 (*) [32])((long)pvVar20 + lVar18 + lVar31);
        auVar7 = *(undefined1 (*) [32])((long)pvVar20 + lVar18 + lVar29);
        auVar8 = vunpcklps_avx(auVar6,auVar38);
        auVar38 = vunpckhps_avx(auVar6,auVar38);
        auVar6 = vunpcklps_avx(auVar39,auVar7);
        auVar39 = vunpckhps_avx(auVar39,auVar7);
        auVar7 = vunpcklpd_avx(auVar8,auVar6);
        auVar6 = vunpckhpd_avx(auVar8,auVar6);
        auVar8 = vunpcklpd_avx(auVar38,auVar39);
        auVar38 = vunpckhpd_avx(auVar38,auVar39);
        auVar39._16_16_ = auVar6._0_16_;
        auVar39._0_16_ = auVar7._0_16_;
        auVar40._16_16_ = auVar38._0_16_;
        auVar40._0_16_ = auVar8._0_16_;
        auVar6 = vperm2f128_avx(auVar7,auVar6,0x31);
        auVar38 = vperm2f128_avx(auVar8,auVar38,0x31);
        *(undefined1 (*) [32])(*pauVar30 + lVar18 * 4) = auVar39;
        *(undefined1 (*) [32])(pauVar30[1] + lVar18 * 4) = auVar40;
        *(undefined1 (*) [32])(pauVar30[2] + lVar18 * 4) = auVar6;
        *(undefined1 (*) [32])(pauVar30[3] + lVar18 * 4) = auVar38;
        pauVar22 = pauVar22 + 4;
        lVar18 = lVar18 + 0x20;
      }
      for (; iVar23 + 3 < max_kk; iVar23 = iVar23 + 4) {
        auVar2 = *(undefined1 (*) [16])((long)pvVar20 + lVar18 + lVar33);
        auVar3 = *(undefined1 (*) [16])((long)pvVar20 + lVar18 + lVar32);
        auVar4 = *(undefined1 (*) [16])((long)pvVar20 + lVar18 + lVar31);
        auVar5 = *(undefined1 (*) [16])((long)pvVar20 + lVar18 + lVar29);
        auVar13 = vunpcklps_avx(auVar2,auVar3);
        auVar14 = vunpcklps_avx(auVar4,auVar5);
        auVar12 = vunpckhps_avx(auVar2,auVar3);
        auVar5 = vunpckhps_avx(auVar4,auVar5);
        auVar2 = vmovlhps_avx(auVar13,auVar14);
        auVar4 = vunpckhpd_avx(auVar13,auVar14);
        auVar3 = vmovlhps_avx(auVar12,auVar5);
        auVar5 = vunpckhpd_avx(auVar12,auVar5);
        *(undefined1 (*) [16])(*pauVar30 + lVar18 * 4) = auVar2;
        *(undefined1 (*) [16])(*pauVar30 + lVar18 * 4 + 0x10) = auVar4;
        *(undefined1 (*) [16])(pauVar30[1] + lVar18 * 4) = auVar3;
        *(undefined1 (*) [16])(pauVar30[1] + lVar18 * 4 + 0x10) = auVar5;
        pauVar22 = pauVar22 + 2;
        lVar18 = lVar18 + 0x10;
      }
      for (; iVar23 < max_kk; iVar23 = iVar23 + 1) {
        *(undefined4 *)(*pauVar30 + lVar18 * 4) = *(undefined4 *)((long)pvVar20 + lVar18 + lVar33);
        *(undefined4 *)(*pauVar30 + lVar18 * 4 + 4) =
             *(undefined4 *)((long)pvVar20 + lVar18 + lVar32);
        *(undefined4 *)(*pauVar30 + lVar18 * 4 + 8) =
             *(undefined4 *)((long)pvVar20 + lVar18 + lVar31);
        *(undefined4 *)(*pauVar30 + lVar18 * 4 + 0xc) =
             *(undefined4 *)((long)pvVar20 + lVar18 + lVar29);
        pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
        lVar18 = lVar18 + 4;
      }
    }
    lVar33 = lVar33 + lVar26;
    lVar32 = lVar32 + lVar26;
    lVar31 = lVar31 + lVar26;
    lVar29 = lVar29 + lVar26;
    pauVar30 = pauVar22;
  }
  for (; (long)(uVar35 | 1) < lVar24; uVar35 = uVar35 + 2) {
    pvVar20 = A->data;
    lVar31 = 0;
    lVar29 = 0;
    pauVar22 = pauVar30;
    for (iVar27 = 0; iVar27 + 7 < max_kk; iVar27 = iVar27 + 8) {
      auVar6 = *(undefined1 (*) [32])((long)pvVar20 + lVar29 + lVar33);
      auVar38 = *(undefined1 (*) [32])((long)pvVar20 + lVar29 + lVar32);
      auVar39 = vunpcklps_avx(auVar6,auVar38);
      auVar6 = vunpckhps_avx(auVar6,auVar38);
      auVar38._16_16_ = auVar6._0_16_;
      auVar38._0_16_ = auVar39._0_16_;
      auVar6 = vperm2f128_avx(auVar39,auVar6,0x31);
      *(undefined1 (*) [32])(*pauVar30 + lVar29 * 2) = auVar38;
      *(undefined1 (*) [32])(pauVar30[1] + lVar29 * 2) = auVar6;
      pauVar22 = pauVar22 + 2;
      lVar29 = lVar29 + 0x20;
      lVar31 = lVar31 + 8;
    }
    for (; iVar27 + 3 < max_kk; iVar27 = iVar27 + 4) {
      auVar2 = *(undefined1 (*) [16])((long)pvVar20 + lVar29 + lVar33);
      auVar3 = *(undefined1 (*) [16])((long)pvVar20 + lVar29 + lVar32);
      auVar4 = vunpcklps_avx(auVar2,auVar3);
      auVar2 = vunpckhps_avx(auVar2,auVar3);
      *(undefined1 (*) [16])(*pauVar30 + lVar29 * 2) = auVar4;
      *(undefined1 (*) [16])(*pauVar30 + lVar29 * 2 + 0x10) = auVar2;
      pauVar22 = pauVar22 + 1;
      lVar29 = lVar29 + 0x10;
      lVar31 = lVar31 + 4;
    }
    for (; (int)lVar31 < max_kk; lVar31 = lVar31 + 1) {
      *(undefined4 *)*pauVar22 = *(undefined4 *)((long)pvVar20 + lVar31 * 4 + lVar33);
      *(undefined4 *)(*pauVar22 + 4) = *(undefined4 *)((long)pvVar20 + lVar31 * 4 + lVar32);
      pauVar22 = (undefined1 (*) [32])(*pauVar22 + 8);
    }
    lVar33 = lVar33 + lVar36 * 8;
    lVar32 = lVar32 + lVar36 * 8;
    pauVar30 = pauVar22;
  }
  for (; (long)uVar35 < lVar24; uVar35 = uVar35 + 1) {
    pvVar20 = A->data;
    pauVar22 = (undefined1 (*) [32])((long)pvVar20 + (long)k * 4 + (uVar35 + lVar28) * lVar36 * 4);
    lVar32 = 0;
    for (iVar27 = 0; iVar27 + 7 < max_kk; iVar27 = iVar27 + 8) {
      *pauVar30 = *pauVar22;
      pauVar30 = pauVar30 + 1;
      pauVar22 = pauVar22 + 1;
      lVar32 = lVar32 + 8;
    }
    for (; iVar27 + 3 < max_kk; iVar27 = iVar27 + 4) {
      *(undefined1 (*) [16])*pauVar30 = *(undefined1 (*) [16])*pauVar22;
      pauVar30 = (undefined1 (*) [32])(*pauVar30 + 0x10);
      pauVar22 = (undefined1 (*) [32])(*pauVar22 + 0x10);
      lVar32 = lVar32 + 4;
    }
    for (; (int)lVar32 < max_kk; lVar32 = lVar32 + 1) {
      *(undefined4 *)*pauVar30 = *(undefined4 *)((long)pvVar20 + lVar32 * 4 + lVar33);
      pauVar30 = (undefined1 (*) [32])(*pauVar30 + 4);
    }
    lVar33 = lVar33 + lVar36 * 4;
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 16;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;
            const float* p1 = (const float*)A + (i + ii + 8) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                _mm256_store_ps(pp + 8, _mm256_load_ps(p1));
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;
            const float* p2 = (const float*)A + (i + ii + 8) * A_hstep + k * 4;
            const float* p3 = (const float*)A + (i + ii + 12) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                _mm_store_ps(pp + 12, _mm_load_ps(p3));
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
            const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
            const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
            const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
            const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
            const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
            const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
            const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
            const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(p0);
                __m512 _r1 = _mm512_loadu_ps(p1);
                __m512 _r2 = _mm512_loadu_ps(p2);
                __m512 _r3 = _mm512_loadu_ps(p3);
                __m512 _r4 = _mm512_loadu_ps(p4);
                __m512 _r5 = _mm512_loadu_ps(p5);
                __m512 _r6 = _mm512_loadu_ps(p6);
                __m512 _r7 = _mm512_loadu_ps(p7);
                __m512 _r8 = _mm512_loadu_ps(p8);
                __m512 _r9 = _mm512_loadu_ps(p9);
                __m512 _ra = _mm512_loadu_ps(pa);
                __m512 _rb = _mm512_loadu_ps(pb);
                __m512 _rc = _mm512_loadu_ps(pc);
                __m512 _rd = _mm512_loadu_ps(pd);
                __m512 _re = _mm512_loadu_ps(pe);
                __m512 _rf = _mm512_loadu_ps(pf);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += 16;
                p1 += 16;
                p2 += 16;
                p3 += 16;
                p4 += 16;
                p5 += 16;
                p6 += 16;
                p7 += 16;
                p8 += 16;
                p9 += 16;
                pa += 16;
                pb += 16;
                pc += 16;
                pd += 16;
                pe += 16;
                pf += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp[12] = pc[0];
                pp[13] = pd[0];
                pp[14] = pe[0];
                pp[15] = pf[0];
                pp += 16;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
                pc++;
                pd++;
                pe++;
                pf++;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 16, _r2);
                _mm256_store_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}